

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parseConst.cpp
# Opt level: O0

bool __thiscall
glslang::TConstTraverser::visitAggregate
          (TConstTraverser *this,TVisit param_1,TIntermAggregate *node)

{
  bool bVar1;
  TOperator TVar2;
  int iVar3;
  undefined4 extraout_var;
  size_type sVar4;
  undefined4 extraout_var_00;
  reference ppTVar5;
  undefined4 extraout_var_01;
  long lVar6;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  ulong uVar7;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  reference ppTVar8;
  bool local_51;
  __normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
  local_40;
  __normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
  local_38;
  iterator p;
  bool flag;
  TIntermAggregate *node_local;
  TVisit param_1_local;
  TConstTraverser *this_local;
  
  bVar1 = TIntermOperator::isConstructor(&node->super_TIntermOperator);
  if ((bVar1) || (TVar2 = TIntermOperator::getOp(&node->super_TIntermOperator), TVar2 == EOpComma))
  {
    iVar3 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
              [0x32])();
    sVar4 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::size
                      ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                       CONCAT44(extraout_var,iVar3));
    local_51 = false;
    if (sVar4 == 1) {
      iVar3 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
                [0x32])();
      ppTVar5 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                          ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                           CONCAT44(extraout_var_00,iVar3),0);
      iVar3 = (*(*ppTVar5)->_vptr_TIntermNode[3])();
      lVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar3) + 0x28))();
      local_51 = lVar6 != 0;
    }
    p._M_current._7_1_ = local_51;
    if (local_51 != false) {
      this->singleConstantParam = true;
      TVar2 = TIntermOperator::getOp(&node->super_TIntermOperator);
      this->constructorType = TVar2;
      iVar3 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
                [0x1e])();
      iVar3 = TType::computeNumComponents((TType *)CONCAT44(extraout_var_02,iVar3));
      this->size = iVar3;
      iVar3 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
                [0x1e])();
      uVar7 = (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar3) + 0xe0))();
      if ((uVar7 & 1) != 0) {
        this->isMatrix = true;
        iVar3 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[0x1e])();
        iVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar3) + 0x68))();
        this->matrixCols = iVar3;
        iVar3 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[0x1e])();
        iVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_05,iVar3) + 0x70))();
        this->matrixRows = iVar3;
      }
    }
    iVar3 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
              [0x32])();
    local_38._M_current =
         (TIntermNode **)
         std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::begin
                   ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                    CONCAT44(extraout_var_06,iVar3));
    while( true ) {
      iVar3 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
                [0x32])();
      local_40._M_current =
           (TIntermNode **)
           std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::end
                     ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                      CONCAT44(extraout_var_07,iVar3));
      bVar1 = __gnu_cxx::operator!=(&local_38,&local_40);
      if (!bVar1) break;
      TVar2 = TIntermOperator::getOp(&node->super_TIntermOperator);
      if (TVar2 == EOpComma) {
        this->index = 0;
      }
      ppTVar8 = __gnu_cxx::
                __normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
                ::operator*(&local_38);
      (*(*ppTVar8)->_vptr_TIntermNode[2])();
      __gnu_cxx::
      __normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
      ::operator++(&local_38,0);
    }
    if ((p._M_current._7_1_ & 1) != 0) {
      this->singleConstantParam = false;
      this->constructorType = EOpNull;
      this->size = 0;
      this->isMatrix = false;
      this->matrixCols = 0;
      this->matrixRows = 0;
    }
  }
  else {
    this->error = true;
  }
  return false;
}

Assistant:

bool TConstTraverser::visitAggregate(TVisit /* visit */, TIntermAggregate* node)
{
    if (! node->isConstructor() && node->getOp() != EOpComma) {
        error = true;

        return false;
    }

    bool flag = node->getSequence().size() == 1 && node->getSequence()[0]->getAsTyped()->getAsConstantUnion();
    if (flag) {
        singleConstantParam = true;
        constructorType = node->getOp();
        size = node->getType().computeNumComponents();

        if (node->getType().isMatrix()) {
            isMatrix = true;
            matrixCols = node->getType().getMatrixCols();
            matrixRows = node->getType().getMatrixRows();
        }
    }

    for (TIntermSequence::iterator p = node->getSequence().begin();
                                   p != node->getSequence().end(); p++) {

        if (node->getOp() == EOpComma)
            index = 0;

        (*p)->traverse(this);
    }
    if (flag)
    {
        singleConstantParam = false;
        constructorType = EOpNull;
        size = 0;
        isMatrix = false;
        matrixCols = 0;
        matrixRows = 0;
    }

    return false;
}